

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

DBGPROP_ATTRIB_FLAGS __thiscall
Js::RecyclableObjectDisplay::GetTypeAttribute(RecyclableObjectDisplay *this)

{
  JavascriptString *pJVar1;
  Var pvVar2;
  ScriptContext *scriptContext;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  JavascriptLibrary *this_00;
  JavascriptString *pJVar6;
  undefined4 *puVar7;
  RecyclableObject *pRVar8;
  ThreadContext *this_01;
  void *unaff_retaddr;
  undefined1 local_f0 [8];
  EnterScriptObject __enterScriptObject;
  ScriptEntryExitRecord __entryExitRecord;
  ScriptContext *__localScriptContext;
  anon_class_16_2_3fdfe927 checkWriteableFunction;
  DBGPROP_ATTRIB_FLAGS flag;
  RecyclableObjectDisplay *this_local;
  TypeId local_54;
  TypeId local_44;
  TypeId local_38;
  TypeId typeId;
  TypeId typeId_1;
  TypeId typeId_2;
  
  checkWriteableFunction.flag._4_4_ = this->defaultAttributes;
  bVar4 = VarIs<Js::RecyclableObject>(this->instance);
  if (bVar4) {
    pJVar1 = (JavascriptString *)this->instance;
    this_00 = ScriptContext::GetLibrary(this->scriptContext);
    pJVar6 = JavascriptLibrary::GetDebuggerDeadZoneBlockVariableString(this_00);
    if (pJVar1 == pJVar6) {
      checkWriteableFunction.flag._4_4_ = checkWriteableFunction.flag._4_4_ | 8;
    }
    else {
      pvVar2 = this->instance;
      if (pvVar2 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      bVar4 = TaggedInt::Is(pvVar2);
      if (bVar4) {
        local_38 = TypeIds_FirstNumberType;
      }
      else {
        bVar4 = JavascriptNumber::Is_NoTaggedIntCheck(pvVar2);
        if (bVar4) {
          local_38 = TypeIds_Number;
        }
        else {
          pRVar8 = UnsafeVarTo<Js::RecyclableObject>(pvVar2);
          if (pRVar8 == (RecyclableObject *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
            if (!bVar4) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          local_38 = RecyclableObject::GetTypeId(pRVar8);
          if ((0x57 < (int)local_38) && (BVar5 = RecyclableObject::IsExternal(pRVar8), BVar5 == 0))
          {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar4) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
        }
      }
      if (local_38 == TypeIds_Function) {
        checkWriteableFunction.flag._4_4_ = checkWriteableFunction.flag._4_4_ | 0x100;
      }
      else {
        pvVar2 = this->instance;
        if (pvVar2 == (Var)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        bVar4 = TaggedInt::Is(pvVar2);
        if (bVar4) {
          local_44 = TypeIds_FirstNumberType;
        }
        else {
          bVar4 = JavascriptNumber::Is_NoTaggedIntCheck(pvVar2);
          if (bVar4) {
            local_44 = TypeIds_Number;
          }
          else {
            pRVar8 = UnsafeVarTo<Js::RecyclableObject>(pvVar2);
            if (pRVar8 == (RecyclableObject *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                          ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
              if (!bVar4) {
                pcVar3 = (code *)invalidInstructionException();
                (*pcVar3)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            local_44 = RecyclableObject::GetTypeId(pRVar8);
            if ((0x57 < (int)local_44) && (BVar5 = RecyclableObject::IsExternal(pRVar8), BVar5 == 0)
               ) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                          ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                          "GetTypeId aValue has invalid TypeId");
              if (!bVar4) {
                pcVar3 = (code *)invalidInstructionException();
                (*pcVar3)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
          }
        }
        if (local_44 != TypeIds_String) {
          pvVar2 = this->instance;
          if (pvVar2 == (Var)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
            if (!bVar4) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          bVar4 = TaggedInt::Is(pvVar2);
          if (bVar4) {
            local_54 = TypeIds_FirstNumberType;
          }
          else {
            bVar4 = JavascriptNumber::Is_NoTaggedIntCheck(pvVar2);
            if (bVar4) {
              local_54 = TypeIds_Number;
            }
            else {
              pRVar8 = UnsafeVarTo<Js::RecyclableObject>(pvVar2);
              if (pRVar8 == (RecyclableObject *)0x0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 1;
                bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                            ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
                if (!bVar4) {
                  pcVar3 = (code *)invalidInstructionException();
                  (*pcVar3)();
                }
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 0;
              }
              local_54 = RecyclableObject::GetTypeId(pRVar8);
              if ((0x57 < (int)local_54) &&
                 (BVar5 = RecyclableObject::IsExternal(pRVar8), BVar5 == 0)) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 1;
                bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                            ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                            "GetTypeId aValue has invalid TypeId");
                if (!bVar4) {
                  pcVar3 = (code *)invalidInstructionException();
                  (*pcVar3)();
                }
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 0;
              }
            }
          }
          if (local_54 != TypeIds_StringObject) goto LAB_00c68a4e;
        }
        checkWriteableFunction.flag._4_4_ = checkWriteableFunction.flag._4_4_ | 0x400;
      }
    }
  }
LAB_00c68a4e:
  checkWriteableFunction.this = (RecyclableObjectDisplay *)((long)&checkWriteableFunction.flag + 4);
  __localScriptContext = (ScriptContext *)this;
  this_01 = ScriptContext::GetThreadContext(this->scriptContext);
  bVar4 = ThreadContext::IsScriptActive(this_01);
  if (bVar4) {
    GetTypeAttribute::anon_class_16_2_3fdfe927::operator()
              ((anon_class_16_2_3fdfe927 *)&__localScriptContext);
  }
  else {
    scriptContext = this->scriptContext;
    __enterScriptObject.library = (JavascriptLibrary *)0x0;
    EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)local_f0,scriptContext,
               (ScriptEntryExitRecord *)&__enterScriptObject.library,unaff_retaddr,&stack0x00000000,
               false,false,false);
    ScriptContext::OnScriptStart(scriptContext,false,true);
    EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_f0);
    GetTypeAttribute::anon_class_16_2_3fdfe927::operator()
              ((anon_class_16_2_3fdfe927 *)&__localScriptContext);
    EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_f0);
  }
  return checkWriteableFunction.flag._4_4_;
}

Assistant:

DBGPROP_ATTRIB_FLAGS RecyclableObjectDisplay::GetTypeAttribute()
    {
        DBGPROP_ATTRIB_FLAGS flag = defaultAttributes;

        if (Js::VarIs<Js::RecyclableObject>(instance))
        {
            if (instance == scriptContext->GetLibrary()->GetDebuggerDeadZoneBlockVariableString())
            {
                flag |= DBGPROP_ATTRIB_VALUE_IS_INVALID;
            }
            else if (JavascriptOperators::GetTypeId(instance) == TypeIds_Function)
            {
                flag |= DBGPROP_ATTRIB_VALUE_IS_METHOD;
            }
            else if (JavascriptOperators::GetTypeId(instance) == TypeIds_String
                || JavascriptOperators::GetTypeId(instance) == TypeIds_StringObject)
            {
                flag |= DBGPROP_ATTRIB_VALUE_IS_RAW_STRING;
            }
        }

        auto checkWriteableFunction = [&]()
        {
            if (pObjAddress && !pObjAddress->IsWritable())
            {
                flag |= DBGPROP_ATTRIB_VALUE_READONLY;
            }
        };

        if (!scriptContext->GetThreadContext()->IsScriptActive())
        {
            BEGIN_JS_RUNTIME_CALL_EX(scriptContext, false);
            {
                IGNORE_STACKWALK_EXCEPTION(scriptContext);
                checkWriteableFunction();
            }
            END_JS_RUNTIME_CALL(scriptContext);
        }
        else
        {
            checkWriteableFunction();
        }
        // TODO : need to identify Events explicitly for fastDOM

        return flag;
    }